

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

unsigned_long_long kj::anon_unknown_55::parseUnsigned(StringPtr *s,unsigned_long_long max)

{
  bool bVar1;
  int *piVar2;
  char *__nptr;
  char *s_00;
  int __base;
  Fault local_170;
  Fault f_4;
  undefined1 local_160 [8];
  DebugComparison<char,_char> _kjCondition_4;
  Fault f_3;
  undefined1 local_130 [8];
  DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> _kjCondition_3;
  Fault f_2;
  int *local_f8;
  undefined1 local_f0 [8];
  DebugComparison<int_&,_int> _kjCondition_2;
  Fault f_1;
  char **local_b8;
  undefined1 local_b0 [8];
  DebugComparison<char_*&,_const_char_*> _kjCondition_1;
  unsigned_long_long value;
  char *endPtr;
  Fault local_68;
  Fault f;
  StringPtr *local_58;
  undefined1 local_50 [8];
  DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> _kjCondition;
  unsigned_long_long max_local;
  StringPtr *s_local;
  
  _kjCondition._32_8_ = max;
  local_58 = (StringPtr *)
             kj::_::DebugExpressionStart::operator<<((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,s)
  ;
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::StringPtr_const&>::operator!=
            ((DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_50,
             (DebugExpression<kj::StringPtr_const&> *)&local_58,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    __nptr = StringPtr::begin(s);
    s_00 = StringPtr::cStr(s);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    _kjCondition_1._32_8_ = strtoull(__nptr,(char **)&value,__base);
    local_b8 = (char **)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&value);
    f_1.exception = (Exception *)StringPtr::end(s);
    kj::_::DebugExpression<char*&>::operator==
              ((DebugComparison<char_*&,_const_char_*> *)local_b0,
               (DebugExpression<char*&> *)&local_b8,(char **)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
    if (bVar1) {
      piVar2 = __errno_location();
      local_f8 = (int *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,piVar2);
      f_2.exception._4_4_ = 0x22;
      kj::_::DebugExpression<int&>::operator!=
                ((DebugComparison<int_&,_int> *)local_f0,(DebugExpression<int&> *)&local_f8,
                 (int *)((long)&f_2.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
      if (bVar1) {
        f_3.exception =
             (Exception *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long_long *)&_kjCondition_1.result);
        kj::_::DebugExpression<unsigned_long_long&>::operator<=
                  ((DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *)local_130,
                   (DebugExpression<unsigned_long_long&> *)&f_3,
                   (unsigned_long_long *)&_kjCondition.result);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_130);
        if (bVar1) {
          f_4.exception._6_1_ = StringPtr::operator[](s,0);
          f_4.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char *)((long)&f_4.exception + 6));
          f_4.exception._5_1_ = 0x2d;
          kj::_::DebugExpression<char>::operator!=
                    ((DebugComparison<char,_char> *)local_160,
                     (DebugExpression<char> *)((long)&f_4.exception + 7),
                     (char *)((long)&f_4.exception + 5));
          bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_160);
          if (bVar1) {
            s_local = (StringPtr *)_kjCondition_1._32_8_;
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<char,char>&,char_const(&)[19],kj::StringPtr_const&>
                      (&local_170,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                       ,0x48,FAILED,"s[0] != \'-\'","_kjCondition,\"Value out-of-range\", s",
                       (DebugComparison<char,_char> *)local_160,(char (*) [19])"Value out-of-range",
                       s);
            s_local = (StringPtr *)0x0;
            kj::_::Debug::Fault::~Fault(&local_170);
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
                    ((Fault *)&_kjCondition_4.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x46,FAILED,"value <= max","_kjCondition,\"Value out-of-range\", value, max",
                     (DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *)local_130,
                     (char (*) [19])"Value out-of-range",
                     (unsigned_long_long *)&_kjCondition_1.result,
                     (unsigned_long_long *)&_kjCondition.result);
          s_local = (StringPtr *)0x0;
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_4.result);
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[19],kj::StringPtr_const&>
                  ((Fault *)&_kjCondition_3.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                   ,0x45,FAILED,"errno != ERANGE","_kjCondition,\"Value out-of-range\", s",
                   (DebugComparison<int_&,_int> *)local_f0,(char (*) [19])"Value out-of-range",s);
        s_local = (StringPtr *)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3.result);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[37],kj::StringPtr_const&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                 ,0x44,FAILED,"endPtr == s.end()",
                 "_kjCondition,\"String does not contain valid number\", s",
                 (DebugComparison<char_*&,_const_char_*> *)local_b0,
                 (char (*) [37])"String does not contain valid number",s);
      s_local = (StringPtr *)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2.result);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr_const&,decltype(nullptr)>&,char_const(&)[37],kj::StringPtr_const&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
               ,0x40,FAILED,"s != nullptr",
               "_kjCondition,\"String does not contain valid number\", s",
               (DebugComparison<const_kj::StringPtr_&,_std::nullptr_t> *)local_50,
               (char (*) [37])"String does not contain valid number",s);
    s_local = (StringPtr *)0x0;
    kj::_::Debug::Fault::~Fault(&local_68);
  }
  return (unsigned_long_long)s_local;
}

Assistant:

unsigned long long parseUnsigned(const StringPtr& s, unsigned long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value <= max, "Value out-of-range", value, max) { return 0; }
  //strtoull("-1") does not fail with ERANGE
  KJ_REQUIRE(s[0] != '-', "Value out-of-range", s) { return 0; }
  return value;
}